

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamclient.cpp
# Opt level: O1

int __thiscall
hbm::streaming::StreamClient::start
          (StreamClient *this,string *address,string *streamPort,string *controlPort)

{
  uint signalNumber;
  int iVar1;
  ssize_t sVar2;
  size_t sVar3;
  Value *pVVar4;
  long *plVar5;
  ostream *poVar6;
  socklen_t __len;
  ulong uVar7;
  size_t len;
  size_t size;
  size_t __n;
  string method;
  TransportHeader transportHeader;
  MetaInformation metaInformation;
  uchar dataRecvBuffer [8192];
  string local_20e0;
  TransportHeader local_20c0;
  MetaInformation local_20a8;
  Value local_2060;
  undefined1 *local_2038 [2];
  undefined1 local_2028 [8184];
  
  __len = (socklen_t)controlPort;
  std::__cxx11::string::string
            ((string *)local_2038,(address->_M_dataplus)._M_p,(allocator *)&local_20a8);
  iVar1 = SocketNonblocking::connect
                    (&this->m_streamSocket,(int)local_2038,(sockaddr *)streamPort,__len);
  if (local_2038[0] != local_2028) {
    operator_delete(local_2038[0]);
  }
  if (iVar1 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"could not connect to streming port ",0x23);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(address->_M_dataplus)._M_p,address->_M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(streamPort->_M_dataplus)._M_p,streamPort->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar1 = -1;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->m_address);
    std::__cxx11::string::_M_assign((string *)&this->m_streamPort);
    std::__cxx11::string::_M_assign((string *)&this->m_controlPort);
    TransportHeader::TransportHeader(&local_20c0,&this->m_streamSocket);
    sVar2 = TransportHeader::receive(&local_20c0);
    iVar1 = (int)sVar2;
    size = local_20c0.m_dataByteCount;
    signalNumber = local_20c0.m_signalNumber;
    while (-1 < iVar1) {
      local_20c0.m_dataByteCount = size;
      local_20c0.m_signalNumber = signalNumber;
      if (local_20c0.m_type == TYPE_META) {
        MetaInformation::MetaInformation(&local_20a8,&this->m_streamSocket,size);
        if (local_20a8.m_type == 1) {
          Json::Value::Value(&local_2060,&local_20a8.m_jsonContent);
          pVVar4 = Json::Value::operator[](&local_2060,"method");
          Json::Value::asString_abi_cxx11_(&local_20e0,pVVar4);
          pVVar4 = Json::Value::operator[](&local_2060,"params");
          if (signalNumber == 0) {
            processStreamMetaInformation(this,&local_20e0,pVVar4);
          }
          else if (this->m_pSignalContainer != (SignalContainer *)0x0) {
            SignalContainer::processMetaInformation
                      (this->m_pSignalContainer,signalNumber,&local_20e0,pVVar4);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_20e0._M_dataplus._M_p != &local_20e0.field_2) {
            operator_delete(local_20e0._M_dataplus._M_p);
          }
          Json::Value::~Value(&local_2060);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Signal number ",0xe);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,": unhandled meta information of type ",0x25);
          plVar5 = (long *)std::ostream::operator<<(poVar6,local_20a8.m_type);
          std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
          std::ostream::put((char)plVar5);
          std::ostream::flush();
        }
        if (local_20a8.m_binaryContent.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_20a8.m_binaryContent.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        Json::Value::~Value(&local_20a8.m_jsonContent);
      }
      else if (local_20c0.m_type == TYPE_DATA) {
        __n = 0;
        do {
          if (size == 0) break;
          uVar7 = 0x2000;
          if (size < 0x2000) {
            uVar7 = size;
          }
          sVar2 = SocketNonblocking::receiveComplete
                            (&this->m_streamSocket,(void *)((long)local_2038 + __n),uVar7 - __n);
          if (0 < sVar2) {
            len = __n + sVar2;
            if (this->m_pSignalContainer == (SignalContainer *)0x0) {
              __n = 0;
            }
            else {
              sVar3 = SignalContainer::processMeasuredData
                                (this->m_pSignalContainer,signalNumber,(uchar *)local_2038,len);
              __n = len - sVar3;
              memmove(local_2038,(void *)((long)local_2038 + sVar3),__n);
              len = sVar3;
            }
            size = size - len;
          }
        } while (0 < sVar2);
      }
      sVar2 = TransportHeader::receive(&local_20c0);
      size = local_20c0.m_dataByteCount;
      signalNumber = local_20c0.m_signalNumber;
      iVar1 = (int)sVar2;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"stream client ",0xe);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->m_address)._M_dataplus._M_p,
                        (this->m_address)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(this->m_streamPort)._M_dataplus._M_p,
                        (this->m_streamPort)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," stopped",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  return iVar1;
}

Assistant:

int StreamClient::start(const std::string& address, const std::string &streamPort, const std::string& controlPort)
		{
			int result = m_streamSocket.connect(address.c_str(), streamPort);
			if (result < 0) {
				std::cerr << "could not connect to streming port " << address << ":" << streamPort << std::endl;
				return -1;
			}

			m_address = address;
			m_streamPort = streamPort;
			m_controlPort = controlPort;

			unsigned char dataRecvBuffer[8192];

			TransportHeader transportHeader(m_streamSocket);
			do {
				result = transportHeader.receive();
				if (result < 0) {
					break;
				}
				int type = transportHeader.type();
				size_t bytesToProcess = transportHeader.size();
				unsigned int signalNumber = transportHeader.signalNumber();

				if (type == TYPE_DATA) {
					// read and process measured data. This happens really often! Be sure to be as efficient as possible here.

					size_t bytesInBuffer = 0;
					size_t bytesToReadToBuffer;
					while(bytesToProcess>0) {
						if(bytesToProcess>sizeof(dataRecvBuffer)) {
							bytesToReadToBuffer = sizeof(dataRecvBuffer)-bytesInBuffer;
						} else {
							bytesToReadToBuffer = bytesToProcess-bytesInBuffer;
						}
						ssize_t bytesReadToBuffer = m_streamSocket.receiveComplete(dataRecvBuffer+bytesInBuffer, bytesToReadToBuffer);
						if(bytesReadToBuffer<=0) {
							break;
						}
						bytesInBuffer += bytesReadToBuffer;

						if (m_pSignalContainer) {
							size_t bytesProcessedFromBuffer = m_pSignalContainer->processMeasuredData(signalNumber, dataRecvBuffer, bytesInBuffer);
							bytesToProcess -= bytesProcessedFromBuffer;
							bytesInBuffer -= bytesProcessedFromBuffer;
							memmove(dataRecvBuffer, dataRecvBuffer+bytesProcessedFromBuffer, bytesInBuffer);
						} else {
							bytesToProcess -= bytesInBuffer;
							bytesInBuffer = 0;
						}
					}
				} else if (type == TYPE_META){
					MetaInformation metaInformation(m_streamSocket, bytesToProcess);
					if(metaInformation.type()!=METAINFORMATION_JSON) {
						std::cout << "Signal number " << signalNumber << ": unhandled meta information of type " << metaInformation.type() << std::endl;
					} else {
						const Json::Value& content = metaInformation.jsonContent();
						std::string method = content[METHOD].asString();
						const Json::Value& params = content[PARAMS];

						if (signalNumber == 0) {
							// stream related meta information
							processStreamMetaInformation(method, params);
						} else {
							// signal related meta information
							if (m_pSignalContainer) {
								m_pSignalContainer->processMetaInformation(signalNumber, method, params);
							}
						}
					}
				}
			} while(true);
			
			std::cout << "stream client " << m_address << ":" << m_streamPort << " stopped" << std::endl;

			return result;
		}